

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_fwd.hpp
# Opt level: O0

void __thiscall
toml::source_location::source_location(source_location *this,source_location *param_2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000018;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000020;
  
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  uVar5 = in_RSI[4];
  uVar6 = in_RSI[5];
  uVar7 = in_RSI[7];
  in_RDI[6] = in_RSI[6];
  in_RDI[7] = uVar7;
  in_RDI[4] = uVar5;
  in_RDI[5] = uVar6;
  in_RDI[2] = uVar3;
  in_RDI[3] = uVar4;
  *in_RDI = uVar1;
  in_RDI[1] = uVar2;
  std::__cxx11::string::string(in_stack_00000010,in_stack_00000008);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

source_location(source_location const&) = default;